

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O0

ssize_t __thiscall
xmrig::DaemonClient::send(DaemonClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  String *pSVar4;
  undefined4 extraout_var;
  socklen_t __len;
  HttpClient *client;
  String *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  HttpClient *this_00;
  String *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 uVar5;
  HttpsClient *in_stack_ffffffffffffffa0;
  IHttpListener *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffbc;
  HttpClient *in_stack_ffffffffffffffc0;
  HttpClient *local_30;
  
  bVar1 = Pool::isTLS((Pool *)0x1eb067);
  if (bVar1) {
    local_30 = (HttpClient *)operator_new(0x988);
    uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    String::String(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    __len = (int)this + 0x278;
    pSVar4 = Pool::fingerprint(&(this->super_BaseClient).m_pool);
    HttpsClient::HttpsClient
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(String *)this,
               (IHttpListener *)CONCAT44(__fd,in_stack_ffffffffffffff88),(char *)local_30,
               (size_t)pSVar4,(String *)CONCAT44(in_stack_ffffffffffffffb4,uVar5));
    String::~String(in_stack_ffffffffffffff30);
  }
  else {
    local_30 = (HttpClient *)operator_new(0x108);
    uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffff9c);
    String::String(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    __len = (int)this + 0x278;
    HttpClient::HttpClient
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               (String *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
               CONCAT44(uVar5,in_stack_ffffffffffffff98));
    String::~String(in_stack_ffffffffffffff30);
  }
  this_00 = local_30;
  bVar1 = BaseClient::isQuiet(&this->super_BaseClient);
  HttpClient::setQuiet(this_00,bVar1);
  pSVar4 = Pool::host((Pool *)0x1eb2a4);
  uVar2 = Pool::port((Pool *)0x1eb2ba);
  iVar3 = HttpClient::connect(local_30,(int)pSVar4,(sockaddr *)(ulong)uVar2,__len);
  return CONCAT44(extraout_var,iVar3);
}

Assistant:

void xmrig::DaemonClient::send(int method, const char *url, const char *data, size_t size)
{
    LOG_DEBUG("[%s:%d] " MAGENTA_BOLD("\"%s %s\"") BLACK_BOLD_S " send (%zu bytes): \"%.*s\"",
              m_pool.host().data(),
              m_pool.port(),
              http_method_str(static_cast<http_method>(method)),
              url,
              size,
              static_cast<int>(size),
              data);

    HttpClient *client;
#   ifdef XMRIG_FEATURE_TLS
    if (m_pool.isTLS()) {
        client = new HttpsClient(method, url, this, data, size, m_pool.fingerprint());
    }
    else
#   endif
    {
        client = new HttpClient(method, url, this, data, size);
    }

    client->setQuiet(isQuiet());
    client->connect(m_pool.host(), m_pool.port());
}